

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void setDoNotMergeFlagOnCopy(Vdbe *v)

{
  Op *pOVar1;
  
  if (v->db->mallocFailed == '\0') {
    pOVar1 = v->aOp + (long)v->nOp + -1;
  }
  else {
    pOVar1 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  if ((pOVar1->opcode == 'P') && (0 < (long)v->nOp)) {
    v->aOp[(long)v->nOp + -1].p5 = 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE VdbeOp *sqlite3VdbeGetOp(Vdbe *p, int addr){
  /* C89 specifies that the constant "dummy" will be initialized to all
  ** zeros, which is correct.  MSVC generates a warning, nevertheless. */
  static VdbeOp dummy;  /* Ignore the MSVC warning about no initializer */
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( (addr>=0 && addr<p->nOp) || p->db->mallocFailed );
  if( p->db->mallocFailed ){
    return (VdbeOp*)&dummy;
  }else{
    return &p->aOp[addr];
  }
}